

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

void __thiscall libtorrent::torrent_info::torrent_info(torrent_info *this,info_hash_t *info_hash)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  vector<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_> *pvVar6;
  
  file_storage::file_storage(&this->m_files);
  memset(&this->m_orig_files,0,0xf0);
  (this->m_comment)._M_dataplus._M_p = (pointer)&(this->m_comment).field_2;
  (this->m_comment)._M_string_length = 0;
  (this->m_comment).field_2._M_local_buf[0] = '\0';
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  (this->m_created_by)._M_string_length = 0;
  (this->m_created_by).field_2._M_local_buf[0] = '\0';
  pvVar6 = &(this->m_info_dict).m_tokens;
  (pvVar6->
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar6->
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_info_dict).m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->m_info_dict).m_root_tokens + 4) = (undefined1  [16])0x0;
  (this->m_info_dict).m_token_idx = -1;
  (this->m_info_dict).m_last_index = -1;
  (this->m_info_dict).m_last_token = -1;
  (this->m_info_dict).m_size = -1;
  this->m_creation_date = 0;
  uVar1 = *(undefined8 *)((info_hash->v1).m_number._M_elems + 2);
  uVar2 = *(undefined8 *)((info_hash->v1).m_number._M_elems + 4);
  uVar3 = *(undefined8 *)((info_hash->v2).m_number._M_elems + 1);
  uVar4 = *(undefined8 *)((info_hash->v2).m_number._M_elems + 3);
  uVar5 = *(undefined8 *)((info_hash->v2).m_number._M_elems + 5);
  *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems =
       *(undefined8 *)(info_hash->v1).m_number._M_elems;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1) = uVar3;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) = uVar4;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) = uVar5;
  (this->m_info_hash).v2.m_number._M_elems[7] = (info_hash->v2).m_number._M_elems[7];
  (this->m_flags).m_val = '\0';
  this->m_piece_hashes = 0;
  this->m_info_section_size = 0;
  return;
}

Assistant:

torrent_info::torrent_info(info_hash_t const& info_hash)
		: m_info_hash(info_hash)
	{}